

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

SPARCCPU_conflict1 * cpu_sparc_init_sparc64(uc_struct_conflict9 *uc)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  target_ulong tVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  SPARCCPU_conflict1 *cs;
  SPARCCPU_conflict1 *cpu;
  
  cs = (SPARCCPU_conflict1 *)malloc(0xb440);
  if (cs == (SPARCCPU_conflict1 *)0x0) {
LAB_00a4a8a5:
    cs = (SPARCCPU_conflict1 *)0x0;
  }
  else {
    memset(cs,0,0xb440);
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 0xb;
    }
    else if (0x10 < (uint)uc->cpu_model) {
      free(cs);
      goto LAB_00a4a8a5;
    }
    (cs->parent_obj).cc = &(cs->cc).parent_class;
    (cs->parent_obj).uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)cs;
    cpu_class_init((uc_struct *)uc,&(cs->cc).parent_class);
    (cs->cc).parent_reset = (_func_void_CPUState_ptr *)(cs->cc).parent_class.reset;
    (cs->cc).parent_class.reset = sparc_cpu_reset;
    (cs->cc).parent_class.has_work = sparc_cpu_has_work;
    (cs->cc).parent_class.do_interrupt = sparc_cpu_do_interrupt_sparc64;
    (cs->cc).parent_class.cpu_exec_interrupt = sparc_cpu_exec_interrupt;
    (cs->cc).parent_class.set_pc = sparc_cpu_set_pc;
    (cs->cc).parent_class.synchronize_from_tb = sparc_cpu_synchronize_from_tb;
    (cs->cc).parent_class.tlb_fill_cpu = sparc_cpu_tlb_fill_sparc64;
    (cs->cc).parent_class.do_unaligned_access = sparc_cpu_do_unaligned_access_sparc64;
    (cs->cc).parent_class.get_phys_page_debug = sparc_cpu_get_phys_page_debug_sparc64;
    (cs->cc).parent_class.tcg_initialize = sparc_tcg_init_sparc64;
    cpu_common_initfn((uc_struct *)uc,(CPUState *)cs);
    iVar1 = uc->cpu_model;
    (cs->cc).cpu_def = sparc_defs + iVar1;
    (cs->env).uc = (uc_struct_conflict8 *)uc;
    (cs->parent_obj).env_ptr = &cs->env;
    (cs->parent_obj).icount_decr_ptr = &(cs->neg).icount_decr;
    tVar5 = sparc_defs[iVar1].iu_version;
    uVar2 = sparc_defs[iVar1].fpu_version;
    uVar3 = sparc_defs[iVar1].mmu_version;
    uVar6 = sparc_defs[iVar1].mmu_bm;
    uVar7 = sparc_defs[iVar1].mmu_ctpr_mask;
    uVar12 = sparc_defs[iVar1].mmu_cxr_mask;
    uVar13 = sparc_defs[iVar1].mmu_sfsr_mask;
    uVar14 = sparc_defs[iVar1].mmu_trcr_mask;
    uVar15 = sparc_defs[iVar1].mxcc_version;
    uVar8 = sparc_defs[iVar1].features;
    uVar9 = sparc_defs[iVar1].nwindows;
    uVar10 = sparc_defs[iVar1].maxtl;
    uVar11 = *(undefined4 *)&sparc_defs[iVar1].field_0x3c;
    (cs->env).def.name = sparc_defs[iVar1].name;
    (cs->env).def.iu_version = tVar5;
    (cs->env).def.fpu_version = uVar2;
    (cs->env).def.mmu_version = uVar3;
    (cs->env).def.mmu_bm = uVar6;
    (cs->env).def.mmu_ctpr_mask = uVar7;
    (cs->env).def.features = uVar8;
    (cs->env).def.nwindows = uVar9;
    (cs->env).def.maxtl = uVar10;
    *(undefined4 *)&(cs->env).def.field_0x3c = uVar11;
    (cs->env).def.mmu_cxr_mask = uVar12;
    (cs->env).def.mmu_sfsr_mask = uVar13;
    (cs->env).def.mmu_trcr_mask = uVar14;
    (cs->env).def.mxcc_version = uVar15;
    uVar4 = (cs->env).def.iu_version;
    (cs->env).version = uVar4;
    uVar2 = (cs->env).def.mmu_version;
    (cs->env).fsr = (ulong)(cs->env).def.fpu_version;
    uVar3 = (cs->env).def.nwindows;
    (cs->env).nwindows = uVar3;
    (cs->env).mmu_version = uVar2;
    uVar2 = (cs->env).def.maxtl;
    (cs->env).maxtl = uVar2;
    (cs->env).version = (uVar3 - 1 | uVar2 << 8) | uVar4;
    cpu_exec_realizefn_sparc64((CPUState *)cs);
    cpu_address_space_init_sparc64((CPUState *)cs,0,(cs->parent_obj).memory);
    qemu_init_vcpu_sparc64((CPUState *)cs);
  }
  return cs;
}

Assistant:

SPARCCPU *cpu_sparc_init(struct uc_struct *uc)
{
    SPARCCPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    SPARCCPUClass *scc;

    cpu = malloc(sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }
    memset(cpu, 0, sizeof(*cpu));

    if (uc->cpu_model == INT_MAX) {
#ifdef TARGET_SPARC64
        uc->cpu_model = UC_CPU_SPARC64_SUN_ULTRASPARC_IV; // Sun UltraSparc IV
#else
        uc->cpu_model = UC_CPU_SPARC32_LEON3; // Leon 3
#endif
    } else if (uc->cpu_model >= ARRAY_SIZE(sparc_defs)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = cs;

    /* init CPUClass */
    cpu_class_init(uc, cc);
    /* init SPARCCPUClass */
    sparc_cpu_class_init(uc, cc);
    /* init CPUState */
    cpu_common_initfn(uc, cs);
    /* init SPARC types scc->def */
    scc = SPARC_CPU_CLASS(cc);
    scc->cpu_def = &sparc_defs[uc->cpu_model];

    /* init SPARCCPU */
    sparc_cpu_initfn(uc, cs);
    /* realize SPARCCPU */
    sparc_cpu_realizefn(uc, cs);
    /* realize CPUState */

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}